

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.cc
# Opt level: O1

bool libwebm::GetFileContents(string *file_name,string *contents)

{
  byte bVar1;
  int iVar2;
  __off_t _Var3;
  ifstream file;
  undefined1 *local_2d0 [2];
  undefined1 local_2c0 [16];
  stat local_2b0;
  long local_220 [4];
  byte abStack_200 [488];
  
  std::ifstream::ifstream(local_220,(file_name->_M_dataplus)._M_p,_S_in);
  local_2b0.st_size = 0;
  iVar2 = stat((file_name->_M_dataplus)._M_p,&local_2b0);
  _Var3 = 0;
  if (iVar2 == 0) {
    _Var3 = local_2b0.st_size;
  }
  local_2d0[0] = local_2c0;
  std::__cxx11::string::_M_construct((ulong)local_2d0,(char)_Var3);
  std::__cxx11::string::operator=((string *)contents,(string *)local_2d0);
  if (local_2d0[0] != local_2c0) {
    operator_delete(local_2d0[0]);
  }
  if ((*(int *)(abStack_200 + *(long *)(local_220[0] + -0x18)) == 0) &&
     (contents->_M_string_length != 0)) {
    std::istream::read((char *)local_220,(long)(contents->_M_dataplus)._M_p);
  }
  bVar1 = abStack_200[*(long *)(local_220[0] + -0x18)];
  std::ifstream::~ifstream(local_220);
  return (bVar1 & 5) == 0;
}

Assistant:

bool GetFileContents(const std::string& file_name, std::string* contents) {
  std::ifstream file(file_name.c_str());
  *contents = std::string(static_cast<size_t>(GetFileSize(file_name)), 0);
  if (file.good() && contents->size()) {
    file.read(&(*contents)[0], contents->size());
  }
  return !file.fail();
}